

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O2

double __thiscall llvm::StringError::log(StringError *this,double __x)

{
  error_category *peVar1;
  raw_ostream *in_RSI;
  double extraout_XMM0_Qa;
  double dVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (this->PrintMsgOnly == true) {
    raw_ostream::operator<<(in_RSI,&this->Msg);
    return extraout_XMM0_Qa;
  }
  peVar1 = (this->EC)._M_cat;
  (**(code **)(*(long *)peVar1 + 0x20))(&local_40,peVar1,(this->EC)._M_value);
  raw_ostream::operator<<(in_RSI,&local_40);
  dVar2 = (double)std::__cxx11::string::~string((string *)&local_40);
  if ((this->Msg)._M_string_length != 0) {
    std::operator+(&local_40," ",&this->Msg);
    raw_ostream::operator<<(in_RSI,&local_40);
    dVar2 = (double)std::__cxx11::string::~string((string *)&local_40);
  }
  return dVar2;
}

Assistant:

void StringError::log(raw_ostream &OS) const {
  if (PrintMsgOnly) {
    OS << Msg;
  } else {
    OS << EC.message();
    if (!Msg.empty())
      OS << (" " + Msg);
  }
}